

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::Matcher
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this,string_ref query,
          MatcherOptions *opts)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  MatcherOptions *pMVar3;
  string_ref str;
  string_ref str_00;
  Iterator local_38;
  char *local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_28;
  
  str.ptr_ = (char *)query.len_;
  (this->super_MatchInfo)._vptr_MatchInfo = (_func_int **)&PTR__Matcher_00147ba0;
  (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->item_basename_)._M_current = (char *)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->props_).
  super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->qit_basename_)._M_current = (char *)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->qit_basename_words_).
  super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str.len_ = (size_t)opts;
  pMVar3 = opts;
  decode<cpsm::SimpleStringTraits>(&this->query_,(cpsm *)query.ptr_,str);
  _Var2 = path_basename<cpsm::NonPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  (this->query_basename_)._M_current = _Var2._M_current;
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,bool(*)(char)>
                    ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                     (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,SimpleStringTraits::is_uppercase);
  this->case_sensitive_ = bVar1;
  str_00.len_ = (size_t)pMVar3;
  str_00.ptr_ = (char *)(opts->crfile).len_;
  decode<cpsm::SimpleStringTraits>(&this->crfile_,(cpsm *)(opts->crfile).ptr_,str_00);
  local_30 = (char *)path_basename<cpsm::NonPathTraits,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                               ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                 )(this->crfile_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                 )(this->crfile_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish);
  (this->crfile_basename_)._M_current = local_30;
  local_28.current._M_current =
       (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
       (this->crfile_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,bool(*)(char)>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
              *)&local_38,&local_28,(_func_bool_char *)&local_30);
  (this->crfile_ext_)._M_current = local_38._M_current;
  find_word_endings(&this->crfile_basename_word_ends_,(Iterator)(this->crfile_basename_)._M_current,
                    local_38);
  this->match_crfile_ = opts->match_crfile;
  return;
}

Assistant:

explicit Matcher(boost::string_ref const query, MatcherOptions const& opts)
      // Queries are smartcased (case-sensitive only if any uppercase appears
      // in the query).
      : query_(decode<StringTraits>(query)),
        query_basename_(path_basename<PathTraits>(query_.cbegin(),
                                                  query_.cend())),
        case_sensitive_(std::any_of(query_.cbegin(), query_.cend(),
                                    StringTraits::is_uppercase)),
        crfile_(decode<StringTraits>(opts.crfile)),
        crfile_basename_(path_basename<PathTraits>(crfile_.cbegin(),
                                                   crfile_.cend())),
        crfile_ext_(std::find_if(crfile_.crbegin(),
                                 ReverseIterator(crfile_basename_),
                                 PathTraits::is_extension_separator).base()),
        crfile_basename_word_ends_(find_word_endings(crfile_basename_,
                                                     crfile_ext_)),
        match_crfile_(opts.match_crfile) {}